

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaParserCtxtPtr xmlSchemaNewMemParserCtxt(char *buffer,int size)

{
  xmlSchemaParserCtxtPtr pxVar1;
  xmlDictPtr pxVar2;
  
  if ((0 < size && buffer != (char *)0x0) &&
     (pxVar1 = xmlSchemaParserCtxtCreate(), pxVar1 != (xmlSchemaParserCtxtPtr)0x0)) {
    pxVar1->buffer = buffer;
    pxVar1->size = size;
    pxVar2 = xmlDictCreate();
    pxVar1->dict = pxVar2;
    return pxVar1;
  }
  return (xmlSchemaParserCtxtPtr)0x0;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewMemParserCtxt(const char *buffer, int size)
{
    xmlSchemaParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);
    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->buffer = buffer;
    ret->size = size;
    ret->dict = xmlDictCreate();
    return (ret);
}